

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_is_inttype(int dt)

{
  undefined4 local_c;
  int dt_local;
  
  if (dt == 0) {
    local_c = 0;
  }
  else if (dt == 1) {
    local_c = 0;
  }
  else if (dt == 2) {
    local_c = 1;
  }
  else if (dt == 4) {
    local_c = 1;
  }
  else if (dt == 8) {
    local_c = 1;
  }
  else if (dt == 0x10) {
    local_c = 0;
  }
  else if (dt == 0x20) {
    local_c = 0;
  }
  else if (dt == 0x40) {
    local_c = 0;
  }
  else if (dt == 0x80) {
    local_c = 1;
  }
  else if (dt == 0x100) {
    local_c = 1;
  }
  else if (dt == 0x200) {
    local_c = 1;
  }
  else if (dt == 0x300) {
    local_c = 1;
  }
  else if (dt == 0x400) {
    local_c = 1;
  }
  else if (dt == 0x500) {
    local_c = 1;
  }
  else if (dt == 0x600) {
    local_c = 0;
  }
  else if (dt == 0x700) {
    local_c = 0;
  }
  else if (dt == 0x800) {
    local_c = 0;
  }
  else if (dt == 0x900) {
    local_c = 1;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

int nifti_is_inttype( int dt )
{
   switch( dt ){
     case DT_UNKNOWN:    return 0 ;
     case DT_BINARY:     return 0 ;
     case DT_INT8:       return 1 ;
     case DT_UINT8:      return 1 ;
     case DT_INT16:      return 1 ;
     case DT_UINT16:     return 1 ;
     case DT_INT32:      return 1 ;
     case DT_UINT32:     return 1 ;
     case DT_INT64:      return 1 ;
     case DT_UINT64:     return 1 ;
     case DT_FLOAT32:    return 0 ;
     case DT_FLOAT64:    return 0 ;
     case DT_FLOAT128:   return 0 ;
     case DT_COMPLEX64:  return 0 ;
     case DT_COMPLEX128: return 0 ;
     case DT_COMPLEX256: return 0 ;
     case DT_RGB24:      return 1 ;
     case DT_RGBA32:     return 1 ;
   }
   return 0 ;
}